

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Amr *this;
  LevelBld *a_levelbld;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  Real time;
  int max_step;
  Real stop_time;
  int num_steps;
  Real strt_time;
  int max_coarsening_level;
  Real stop_interval;
  double local_210;
  double local_208;
  int argc_local;
  char **argv_local;
  ParmParse pp;
  _Any_data local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [23];
  
  local_188[0]._M_allocated_capacity = 0;
  local_188[0]._8_8_ = 0;
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  argc_local = argc;
  argv_local = argv;
  amrex::Initialize(&argc_local,&argv_local,true,0,(function<void_()> *)&local_198,
                    (ostream *)&std::cout,(ostream *)&std::cerr,(ErrorHandler)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  local_208 = amrex::ParallelDescriptor::second();
  local_198._M_unused._M_object = local_188;
  local_198._8_8_ = 0;
  local_188[0]._M_allocated_capacity = local_188[0]._M_allocated_capacity & 0xffffffffffffff00;
  amrex::ParmParse::ParmParse(&pp,(string *)&local_198);
  std::__cxx11::string::~string((string *)local_198._M_pod_data);
  max_step = -1;
  num_steps = -1;
  strt_time = 0.0;
  stop_time = -1.0;
  stop_interval = 0.0;
  amrex::ParmParse::query(&pp,"max_step",&max_step,0);
  amrex::ParmParse::query(&pp,"num_steps",&num_steps,0);
  amrex::ParmParse::query(&pp,"strt_time",&strt_time,0);
  amrex::ParmParse::query(&pp,"stop_time",&stop_time,0);
  amrex::ParmParse::query(&pp,"stop_interval",&stop_interval,0);
  if (strt_time < 0.0) {
    amrex::Abort_host("MUST SPECIFY a non-negative strt_time");
  }
  if ((max_step < 0) && (stop_time < 0.0)) {
    amrex::Abort_host("Exiting because neither max_step nor stop_time is non-negative.");
  }
  this = (Amr *)operator_new(0xab0);
  a_levelbld = getLevelBld();
  amrex::Amr::Amr(this,a_levelbld);
  amrex::AmrLevel::m_eb_support_level = 3;
  amrex::AmrLevel::m_eb_basic_grow_cells = 6;
  max_coarsening_level = 100;
  amrex::AmrLevel::m_eb_volume_grow_cells = amrex::AmrLevel::m_eb_basic_grow_cells;
  amrex::AmrLevel::m_eb_full_grow_cells = amrex::AmrLevel::m_eb_basic_grow_cells;
  amrex::ParmParse::query(&pp,"max_coarsening_level",&max_coarsening_level,0);
  iVar3 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  initialize_EB2((this->super_AmrCore).super_AmrMesh.geom.
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar3,iVar3,max_coarsening_level);
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xb])(strt_time,this);
  if (0.0 < stop_interval) {
    stop_time = stop_interval + this->cumtime;
  }
  if (0 < num_steps) {
    iVar1 = num_steps +
            *(this->level_steps).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar3 = max_step;
    if (iVar1 < max_step) {
      iVar3 = iVar1;
    }
    bVar4 = max_step < 0;
    max_step = iVar3;
    if (bVar4) {
      max_step = iVar1;
    }
    poVar2 = amrex::OutStream();
    amrex::Print::Print((Print *)&local_198,poVar2);
    std::operator<<((ostream *)local_188[0]._M_local_buf,"Using effective max_step = ");
    std::ostream::operator<<(local_188,max_step);
    std::operator<<((ostream *)local_188[0]._M_local_buf,'\n');
    amrex::Print::~Print((Print *)&local_198);
  }
  bVar4 = amrex::Amr::RegridOnRestart(this);
  if (bVar4) {
    if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start <
        max_step) {
      if ((stop_time < 0.0) || (time = this->cumtime, time < stop_time)) goto LAB_00497800;
    }
    else {
      time = this->cumtime;
    }
    amrex::Amr::RegridOnly(this,time,true);
  }
LAB_00497800:
  while( true ) {
    iVar1 = amrex::Amr::okToContinue(this);
    iVar3 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (((iVar1 == 0) || (max_step <= iVar3 && -1 < max_step)) ||
       ((stop_time < this->cumtime || stop_time == this->cumtime && (0.0 <= stop_time)))) break;
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xc])(this);
  }
  if (this->last_checkpoint < iVar3) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
    iVar3 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  if (this->last_plotfile < iVar3) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[1])(this);
  local_210 = amrex::ParallelDescriptor::second();
  poVar2 = amrex::OutStream();
  amrex::Print::Print((Print *)&local_198,poVar2);
  std::operator<<((ostream *)local_188[0]._M_local_buf,"Run time = ");
  std::ostream::_M_insert<double>(local_210 - local_208);
  std::endl<char,std::char_traits<char>>((ostream *)local_188[0]._M_local_buf);
  amrex::Print::~Print((Print *)&local_198);
  amrex::Finalize();
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return 0;
}

Assistant:

int
main (int   argc,
      char* argv[])
{
    amrex::Initialize(argc,argv);

    BL_PROFILE_REGION_START("main()");
    BL_PROFILE_VAR("main()", pmain);

    const Real run_strt = ParallelDescriptor::second();

    int  max_step;
    int  num_steps;
    Real strt_time;
    Real stop_time;
    Real stop_interval;

    ParmParse pp;

    max_step  = -1;
    num_steps = -1;
    strt_time =  0.0;
    stop_time = -1.0;
    stop_interval = 0.;

    pp.query("max_step",  max_step);
    pp.query("num_steps", num_steps);
    pp.query("strt_time", strt_time);
    pp.query("stop_time", stop_time);
    pp.query("stop_interval", stop_interval);

    if (strt_time < 0.0)
    {
        amrex::Abort("MUST SPECIFY a non-negative strt_time");
    }

    if (max_step < 0 && stop_time < 0)
    {
        amrex::Abort("Exiting because neither max_step nor stop_time is non-negative.");
    }

    Amr* amrptr = new Amr(getLevelBld());
    //    Amr amr;
#ifdef AMREX_USE_EB
    // fixme? not sure what level of support should be default
    // levels explianed in user guide
    // Ann suggested we need vol and area frac, and face and area centroid => full
    AmrLevel::SetEBSupportLevel(EBSupport::full);
    // set grow cells for basic, volume, full
    // fixme? not sure what these numbers should be
    // AmrLevel.cpp defaults 5, 4, 2
    // CNS::numGrow()= 5
    //AmrLevel::SetEBMaxGrowCells(CNS::numGrow(),4,2);
    // NavierStokesBase GEOM_GROW=1 currently. Change it? Make new var?
    // 4 ghost nodes would be enough for EB-MOL, but 6 are necessary for
    // EB-godunov when StateRedist is used so we will use 6.
    AmrLevel::SetEBMaxGrowCells(6,6,6);

    //decide who should own max_coasening_level later
    int max_coarsening_level = 100;
    pp.query("max_coarsening_level", max_coarsening_level);
    initialize_EB2(amrptr->Geom(amrptr->maxLevel()), amrptr->maxLevel(),
		   max_coarsening_level);
#endif

    amrptr->init(strt_time,stop_time);

    // This feature stop the simulation at a specfic time
    // after the physical time of the checkpoint file
    if (stop_interval > 0.) stop_time = amrptr->cumTime() + stop_interval;

    if (num_steps > 0)
    {
        if (max_step < 0)
        {
            max_step = num_steps + amrptr->levelSteps(0);
        }
        else
        {
            max_step = std::min(max_step, num_steps + amrptr->levelSteps(0));
        }

	amrex::Print() << "Using effective max_step = " << max_step << '\n';
    }
    //
    // If we set the regrid_on_restart flag and if we are *not* going to take
    // a time step then we want to go ahead and regrid here.
    //
    if (amrptr->RegridOnRestart())
    {
        if (    (amrptr->levelSteps(0) >= max_step ) ||
                ( (stop_time >= 0.0) &&
                  (amrptr->cumTime() >= stop_time)  )    )
        {
            //
            // Regrid only!
            //
            amrptr->RegridOnly(amrptr->cumTime());
        }
    }

    while ( amrptr->okToContinue()                            &&
           (amrptr->levelSteps(0) < max_step || max_step < 0) &&
           (amrptr->cumTime() < stop_time || stop_time < 0.0) )
    {
        amrptr->coarseTimeStep(stop_time);
    }
    //
    // Write final checkpoint and plotfile.
    //
    if (amrptr->stepOfLastCheckPoint() < amrptr->levelSteps(0))
    {
        amrptr->checkPoint();
    }

    if (amrptr->stepOfLastPlotFile() < amrptr->levelSteps(0))
    {
        amrptr->writePlotFile();
    }

    delete amrptr;

    const int IOProc   = ParallelDescriptor::IOProcessorNumber();
    Real      run_stop = ParallelDescriptor::second() - run_strt;

    ParallelDescriptor::ReduceRealMax(run_stop,IOProc);

    amrex::Print() << "Run time = " << run_stop << std::endl;

    BL_PROFILE_VAR_STOP(pmain);
    BL_PROFILE_REGION_STOP("main()");
    BL_PROFILE_SET_RUN_TIME(run_stop);
    BL_PROFILE_FINALIZE();


    amrex::Finalize();

    return 0;
}